

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::AddFuncInfoToFinalizationSet(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  TrackAllocData local_40;
  FuncInfo *local_18;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  local_18 = funcInfo;
  funcInfo_local = (FuncInfo *)this;
  if (this->funcInfosToFinalize == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    pAVar1 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&SList<FuncInfo*,Memory::ArenaAllocator,RealCount>::typeinfo,0
               ,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
               ,0x2fe);
    pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar1,&local_40);
    this_00 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
              new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar1,0x3f67b0);
    SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::SList(this_00,this->alloc);
    this->funcInfosToFinalize = this_00;
  }
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Prepend(this->funcInfosToFinalize,&local_18)
  ;
  return;
}

Assistant:

void ByteCodeGenerator::AddFuncInfoToFinalizationSet(FuncInfo * funcInfo)
{
    if (this->funcInfosToFinalize == nullptr)
    {
        this->funcInfosToFinalize = Anew(alloc, SList<FuncInfo*>, alloc);
    }

    this->funcInfosToFinalize->Prepend(funcInfo);
}